

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::mip_level_*>::vector
          (vector<crnlib::mip_level_*> *this,uint n,mip_level **init)

{
  mip_level **ppmVar1;
  long lVar2;
  
  this->m_p = (mip_level **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,n,false,false);
  ppmVar1 = this->m_p;
  for (lVar2 = 0; (ulong)n << 3 != lVar2; lVar2 = lVar2 + 8) {
    *(mip_level **)((long)ppmVar1 + lVar2) = *init;
  }
  this->m_size = n;
  return;
}

Assistant:

inline vector(uint n, const T& init)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(n, false);
    helpers::construct_array(m_p, n, init);
    m_size = n;
  }